

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

ExceptionOr<kj::Promise<kj::HttpServer::Connection::LoopResult>_> * __thiscall
kj::_::ExceptionOr<kj::Promise<kj::HttpServer::Connection::LoopResult>_>::operator=
          (ExceptionOr<kj::Promise<kj::HttpServer::Connection::LoopResult>_> *this,
          ExceptionOr<kj::Promise<kj::HttpServer::Connection::LoopResult>_> *param_1)

{
  Maybe<kj::Exception>::operator=((Maybe<kj::Exception> *)this,(Maybe<kj::Exception> *)param_1);
  Maybe<kj::Promise<kj::HttpServer::Connection::LoopResult>_>::operator=
            (&this->value,&param_1->value);
  return this;
}

Assistant:

ExceptionOr& operator=(ExceptionOr&&) = default;